

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O2

void __thiscall
wabt::CircularArray<wabt::Token,_2UL>::pop_front(CircularArray<wabt::Token,_2UL> *this)

{
  reference pvVar1;
  
  if (this->size_ != 0) {
    pvVar1 = front(this);
    (pvVar1->loc).filename._M_len = 0;
    (pvVar1->loc).filename._M_str = (char *)0x0;
    *(undefined8 *)((long)&(pvVar1->loc).filename._M_str + 4) = 0;
    *(undefined8 *)((long)&(pvVar1->loc).field_1.field_1.offset + 4) = 0;
    pvVar1->token_type_ = First;
    this->front_ = (ulong)(~(uint)this->front_ & 1);
    this->size_ = this->size_ - 1;
    return;
  }
  __assert_fail("size_ > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/circular-array.h"
                ,0x56,
                "void wabt::CircularArray<wabt::Token, 2>::pop_front() [T = wabt::Token, kCapacity = 2]"
               );
}

Assistant:

void pop_front() {
    assert(size_ > 0);
    SetElement(front());
    front_ = (front_ + 1) & kMask;
    --size_;
  }